

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_avail(gz_state *state)

{
  int iVar1;
  uchar *buf;
  long in_RDI;
  uint n;
  uchar *q;
  uchar *p;
  zng_stream *strm;
  uint got;
  int local_34;
  uint *in_stack_ffffffffffffffd0;
  uint *puVar2;
  undefined1 *in_stack_ffffffffffffffd8;
  undefined1 *puVar3;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int local_4;
  
  buf = (uchar *)(in_RDI + 0x80);
  if ((*(int *)(in_RDI + 0x74) == 0) || (*(int *)(in_RDI + 0x74) == -5)) {
    if (*(int *)(in_RDI + 0x50) == 0) {
      if (*(int *)(in_RDI + 0x88) != 0) {
        local_34 = *(int *)(in_RDI + 0x88);
        puVar2 = *(uint **)buf;
        puVar3 = *(undefined1 **)(in_RDI + 0x30);
        do {
          in_stack_ffffffffffffffd0 = (uint *)((long)puVar2 + 1);
          in_stack_ffffffffffffffd8 = puVar3 + 1;
          *puVar3 = (char)*puVar2;
          local_34 = local_34 + -1;
          puVar2 = in_stack_ffffffffffffffd0;
          puVar3 = in_stack_ffffffffffffffd8;
        } while (local_34 != 0);
      }
      iVar1 = gz_load((gz_state *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),buf,
                      (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20),in_stack_ffffffffffffffd0);
      if (iVar1 == -1) {
        return -1;
      }
      *(int *)(buf + 8) = in_stack_ffffffffffffffec + *(int *)(buf + 8);
      *(undefined8 *)buf = *(undefined8 *)(in_RDI + 0x30);
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int gz_avail(gz_state *state) {
    unsigned got;
    PREFIX3(stream) *strm = &(state->strm);

    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;
    if (state->eof == 0) {
        if (strm->avail_in) {       /* copy what's there to the start */
            unsigned char *p = state->in;
            unsigned const char *q = strm->next_in;
            unsigned n = strm->avail_in;
            do {
                *p++ = *q++;
            } while (--n);
        }
        if (gz_load(state, state->in + strm->avail_in, state->size - strm->avail_in, &got) == -1)
            return -1;
        strm->avail_in += got;
        strm->next_in = state->in;
    }
    return 0;
}